

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibration.cpp
# Opt level: O2

void updateSize(void)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar4 = (uint)ABS(calibrationFirstArray[0].x - calibrationFirstArray[1].x);
  uVar5 = (uint)ABS(calibrationFirstArray[0].y - calibrationFirstArray[2].y);
  uVar2 = (uint)ABS((float)calibrationFirstArray._12_8_ - calibrationFirstArray[3].y);
  uVar3 = (uint)ABS(SUB84(calibrationFirstArray._12_8_,4) - calibrationFirstArray[3].x);
  uVar6 = -(uint)((int)uVar2 < (int)uVar5);
  uVar7 = -(uint)((int)uVar3 < (int)uVar4);
  windowResultHeight = ~uVar6 & uVar2 | uVar5 & uVar6;
  windowResultWidth = ~uVar7 & uVar3 | uVar4 & uVar7;
  calibrationSecondArray[3].y = (float)windowResultHeight;
  calibrationSecondArray[1].x = (float)windowResultWidth;
  calibrationSecondArray[3].x = calibrationSecondArray[1].x;
  calibrationSecondArray[2].y = calibrationSecondArray[3].y;
  calibrationSecondArray[1].y = 0.0;
  calibrationSecondArray[2].x = 0.0;
  poVar1 = std::operator<<((ostream *)&std::cout,"\nWarped View now displays a ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,windowResultWidth);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,windowResultHeight);
  poVar1 = std::operator<<(poVar1," frame");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void updateSize(){
    int ABx = abs(calibrationFirstArray[0].x - calibrationFirstArray[1].x);
    int CDx =  abs(calibrationFirstArray[2].x - calibrationFirstArray[3].x);
    windowResultWidth = ABx < CDx ? CDx : ABx;
    int ACy = abs(calibrationFirstArray[0].y - calibrationFirstArray[2].y);
    int BDy =  abs(calibrationFirstArray[1].y - calibrationFirstArray[3].y);
    windowResultHeight = ACy < BDy ? BDy : ACy;
    calibrationSecondArray[1]= Point(windowResultWidth, 0);
    calibrationSecondArray[2] = Point(0, windowResultHeight);
    calibrationSecondArray[3] = Point(windowResultWidth, windowResultHeight);
    cout<<"\nWarped View now displays a "<<windowResultWidth<<"x"<<windowResultHeight<<" frame"<<endl;

}